

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_ul_setup(connectdata *conn,_Bool sizechecked)

{
  Curl_easy *data;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  long lVar10;
  
  data = conn->data;
  lVar8 = (data->state).resume_from;
  bVar2 = lVar8 != 0;
  if ((int)CONCAT71(in_register_00000031,sizechecked) != 0) {
    bVar2 = 0 < lVar8;
  }
  if (bVar2) {
    if (lVar8 < 0) {
      CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      (conn->proto).ftpc.state = FTP_STOR_SIZE;
      return CURLE_OK;
    }
    pvVar1 = (data->req).protop;
    (data->set).ftp_append = true;
    if (conn->seek_func == (curl_seek_callback)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (*conn->seek_func)(conn->seek_client,lVar8,0);
    }
    if (iVar3 != 0) {
      if (iVar3 != 2) {
        pcVar9 = "Could not seek stream";
LAB_006204ea:
        Curl_failf(data,pcVar9);
        return CURLE_FTP_COULDNT_USE_REST;
      }
      lVar8 = 0;
      do {
        lVar10 = (data->state).resume_from - lVar8;
        uVar5 = (data->set).buffer_size;
        if (lVar10 <= (long)uVar5) {
          uVar5 = curlx_sotouz(lVar10);
        }
        sVar6 = (*(data->state).fread_func)((data->state).buffer,1,uVar5,(data->state).in);
        if (uVar5 <= sVar6 - 1) {
          pcVar9 = "Failed to read data";
          goto LAB_006204ea;
        }
        lVar8 = lVar8 + sVar6;
      } while (lVar8 < (data->state).resume_from);
    }
    lVar8 = (data->state).infilesize;
    if ((0 < lVar8) &&
       (lVar10 = (data->state).resume_from, lVar7 = lVar8 - lVar10, (data->state).infilesize = lVar7
       , lVar7 == 0 || lVar8 < lVar10)) {
      Curl_infof(data,"File already completely uploaded\n");
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      *(undefined4 *)((long)pvVar1 + 0x18) = 2;
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
  }
  pcVar9 = "STOR %s";
  if ((data->set).ftp_append != false) {
    pcVar9 = "APPE %s";
  }
  CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,pcVar9,(conn->proto).ftpc.file);
  if (CVar4 == CURLE_OK) {
    (conn->proto).ftpc.state = FTP_STOR;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct connectdata *conn,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  int seekerr = CURL_SEEKFUNC_OK;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
      state(conn, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    data->set.ftp_append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed=0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      do {
        size_t readthisamountnow =
          (data->state.resume_from - passed > data->set.buffer_size) ?
          (size_t)data->set.buffer_size :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded\n");

        /* no data to transfer */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = FTPTRANSFER_NONE;

        state(conn, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  PPSENDF(&ftpc->pp, data->set.ftp_append?"APPE %s":"STOR %s",
          ftpc->file);

  state(conn, FTP_STOR);

  return result;
}